

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismSearcher::softmax_shuffle
          (HomomorphismSearcher *this,vector<int,_std::allocator<int>_> *branch_v,uint branch_v_end)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  result_type_conflict rVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uniform_int_distribution<long_long> dist;
  uniform_int_distribution<long_long> local_40;
  
  uVar4 = HomomorphismModel::largest_target_degree(this->model);
  if (branch_v_end != 0) {
    uVar8 = 0;
    lVar10 = 0;
    do {
      uVar5 = HomomorphismModel::target_degree
                        (this->model,0,
                         (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar8]);
      uVar8 = uVar8 + 1;
      uVar5 = (uVar5 - uVar4) + 0x2d;
      lVar10 = lVar10 + (1L << ((ulong)(~((int)uVar5 >> 0x1f) & uVar5) & 0x3f));
    } while (branch_v_end != uVar8);
    if (branch_v_end != 0) {
      uVar8 = 0;
      do {
        local_40._M_param._M_a = 1;
        local_40._M_param._M_b = lVar10;
        rVar7 = std::uniform_int_distribution<long_long>::operator()
                          (&local_40,&this->global_rand,&local_40._M_param);
        uVar9 = uVar8;
        do {
          uVar5 = branch_v_end - 1;
          if (branch_v_end - 1 == (uint)uVar9) goto LAB_0013dd0e;
          piVar1 = (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar9;
          uVar9 = uVar9 + 1;
          uVar5 = HomomorphismModel::target_degree(this->model,0,*piVar1);
          uVar5 = (uVar5 - uVar4) + 0x2d;
          rVar7 = rVar7 + (-1L << ((ulong)(~((int)uVar5 >> 0x1f) & uVar5) & 0x3f));
        } while (0 < rVar7);
        uVar5 = (int)uVar9 - 1;
LAB_0013dd0e:
        uVar6 = HomomorphismModel::target_degree
                          (this->model,0,
                           (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar5]);
        piVar3 = (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (uVar6 - uVar4) + 0x2d;
        iVar2 = piVar3[uVar5];
        lVar10 = lVar10 + (-1L << ((ulong)(~((int)uVar6 >> 0x1f) & uVar6) & 0x3f));
        piVar3[uVar5] = piVar3[uVar8];
        uVar9 = uVar8 + 1;
        piVar3[uVar8] = iVar2;
        uVar8 = uVar9;
      } while (uVar9 != branch_v_end);
    }
  }
  return;
}

Assistant:

auto HomomorphismSearcher::softmax_shuffle(
    vector<int> & branch_v,
    unsigned branch_v_end) -> void
{
    // repeatedly pick a softmax-biased vertex, move it to the front of branch_v,
    // and then only consider items further to the right in the next iteration.

    // Using floating point here turned out to be way too slow. Fortunately the base
    // of softmax doesn't seem to matter, so we use 2 instead of e, and do everything
    // using bit voodoo.
    auto expish = [largest_target_degree = this->model.largest_target_degree()](int degree) {
        constexpr int sufficient_space_for_adding_up = numeric_limits<long long>::digits - 18;
        auto shift = max<int>(degree - largest_target_degree + sufficient_space_for_adding_up, 0);
        return 1ll << shift;
    };

    long long total = 0;
    for (unsigned v = 0; v < branch_v_end; ++v)
        total += expish(model.target_degree(0, branch_v[v]));

    for (unsigned start = 0; start < branch_v_end; ++start) {
        // pick a random number between 1 and total inclusive
        uniform_int_distribution<long long> dist(1, total);
        long long select_score = dist(global_rand);

        // go over the list until we hit the score
        unsigned select_element = start;
        for (; select_element + 1 < branch_v_end; ++select_element) {
            select_score -= expish(model.target_degree(0, branch_v[select_element]));
            if (select_score <= 0)
                break;
        }

        // move to front
        total -= expish(model.target_degree(0, branch_v[select_element]));
        swap(branch_v[select_element], branch_v[start]);
    }
}